

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_1::GraphicsPipeline::Resources::Resources
          (Resources *this,Environment *env,Parameters *param_2)

{
  pointer pBVar1;
  Parameters *pPVar2;
  Resources *extraout_RDX;
  Resources *extraout_RDX_00;
  Resources *pRVar3;
  VkShaderStageFlags in_R8D;
  undefined1 in_R9B;
  undefined1 local_78 [24];
  VkAllocationCallbacks *pVStack_60;
  undefined1 local_58 [8];
  _Alloc_hider _Stack_50;
  VkDevice local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  pointer local_30;
  
  pBVar1 = (pointer)(local_78 + 0x10);
  local_78._0_8_ = pBVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"vert","");
  local_58._0_4_ = VK_SHADER_STAGE_VERTEX_BIT;
  _Stack_50._M_p = (pointer)&aStack_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_50,local_78._0_8_,
             (undefined1 *)((long)(_func_int ***)local_78._8_8_ + local_78._0_8_));
  Dependency<vkt::api::(anonymous_namespace)::ShaderModule>::Dependency
            (&this->vertexShader,env,(Parameters *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_50._M_p != &aStack_40) {
    operator_delete(_Stack_50._M_p,(ulong)(aStack_40._M_allocated_capacity + 1));
  }
  if ((pointer)local_78._0_8_ != pBVar1) {
    operator_delete((void *)local_78._0_8_,(ulong)((long)(deUint32 *)local_78._16_8_ + 1));
  }
  local_78._0_8_ = pBVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"frag","");
  local_58._0_4_ = 0x10;
  _Stack_50._M_p = (pointer)&aStack_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_50,local_78._0_8_,
             (undefined1 *)((long)(_func_int ***)local_78._8_8_ + local_78._0_8_));
  Dependency<vkt::api::(anonymous_namespace)::ShaderModule>::Dependency
            (&this->fragmentShader,env,(Parameters *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_50._M_p != &aStack_40) {
    operator_delete(_Stack_50._M_p,(ulong)(aStack_40._M_allocated_capacity + 1));
  }
  if ((pointer)local_78._0_8_ != pBVar1) {
    operator_delete((void *)local_78._0_8_,(ulong)((long)(deUint32 *)local_78._16_8_ + 1));
  }
  pPVar2 = (Parameters *)&DAT_00000001;
  DescriptorSetLayout::Parameters::single((Parameters *)local_78,1,0x10,1,in_R8D,(bool)in_R9B);
  PipelineLayout::Parameters::singleDescriptorSet((Parameters *)local_58,(Parameters *)local_78);
  Dependency<vkt::api::(anonymous_namespace)::PipelineLayout>::Dependency
            (&this->layout,env,(Parameters *)local_58);
  if ((VkAllocationCallbacks *)aStack_40._M_allocated_capacity != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)aStack_40._M_allocated_capacity,(long)local_30 - aStack_40._0_8_);
  }
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
             *)local_58);
  pRVar3 = extraout_RDX;
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
    pRVar3 = extraout_RDX_00;
  }
  RenderPass::create((Move<vk::Handle<(vk::HandleType)17>_> *)local_58,env,pRVar3,pPVar2);
  (this->renderPass).object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       local_48;
  (this->renderPass).object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)aStack_40._M_allocated_capacity;
  (this->renderPass).object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal
       = (deUint64)local_58;
  (this->renderPass).object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)_Stack_50._M_p;
  _Stack_50._M_p = (pointer)0x0;
  local_48 = (VkDevice)0x0;
  aStack_40._M_allocated_capacity = 0;
  aStack_40._8_8_ = 0;
  local_58 = (undefined1  [8])0x11;
  ::vk::createPipelineCache
            ((Move<vk::Handle<(vk::HandleType)15>_> *)local_78,env->vkd,env->device,
             (VkPipelineCacheCreateInfo *)local_58,env->allocationCallbacks);
  (this->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
  m_device = (VkDevice)local_78._16_8_;
  (this->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
  m_allocator = pVStack_60;
  (this->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.
  m_internal = local_78._0_8_;
  (this->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_78._8_8_;
  return;
}

Assistant:

Resources (const Environment& env, const Parameters&)
			: vertexShader		(env, ShaderModule::Parameters(VK_SHADER_STAGE_VERTEX_BIT, "vert"))
			, fragmentShader	(env, ShaderModule::Parameters(VK_SHADER_STAGE_FRAGMENT_BIT, "frag"))
			, layout			(env, PipelineLayout::Parameters::singleDescriptorSet(
										DescriptorSetLayout::Parameters::single(0u, VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 1u, VK_SHADER_STAGE_FRAGMENT_BIT, true)))
			, renderPass		(env, RenderPass::Parameters())
			, pipelineCache		(env, PipelineCache::Parameters())
		{}